

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

StatusOr<google::protobuf::FeatureSetDefaults> * __thiscall
google::protobuf::FeatureResolver::CompileDefaults
          (StatusOr<google::protobuf::FeatureSetDefaults> *__return_storage_ptr__,
          FeatureResolver *this,Descriptor *feature_set,
          Span<const_google::protobuf::FieldDescriptor_*const> extensions,Edition minimum_edition,
          Edition maximum_edition)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  FieldDescriptor *pFVar4;
  bool bVar5;
  Descriptor *pDVar6;
  reference pEVar7;
  MessageLite *pMVar8;
  MessageLite *pMVar9;
  Message *fixed;
  Message *overridable;
  void *pvVar10;
  MessageLite *pMVar11;
  pointer ppFVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  Arena *pAVar16;
  FeatureSetDefaults *this_00;
  Edition EVar17;
  long lVar18;
  iterator iVar19;
  Metadata MVar20;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  const_iterator other;
  string_view data;
  string_view data_00;
  basic_string_view<char,_std::char_traits<char>_> args_3;
  string_view message;
  Status _status_3;
  AlphaNum *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  Descriptor *local_c8;
  long *local_c0;
  btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
  editions;
  Status _status_1;
  FeatureSetDefaults defaults;
  
  ppFVar12 = extensions.ptr_;
  EVar17 = (Edition)extensions.len_;
  if ((int)minimum_edition < (int)EVar17) {
    (anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&defaults,"Invalid edition range, edition ",EVar17,
               " is newer than edition ",minimum_edition);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)&defaults);
    if (((ulong)defaults.super_Message.super_MessageLite._vptr_MessageLite & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref
                ((StatusRep *)defaults.super_Message.super_MessageLite._vptr_MessageLite);
    }
  }
  else if (this == (FeatureResolver *)0x0) {
    (anonymous_namespace)::Error<char_const*>
              ((_anonymous_namespace_ *)&defaults,
               "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)&defaults);
    if (((ulong)defaults.super_Message.super_MessageLite._vptr_MessageLite & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref
                ((StatusRep *)defaults.super_Message.super_MessageLite._vptr_MessageLite);
    }
  }
  else {
    local_c8 = (Descriptor *)this;
    anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)&defaults,(Descriptor *)this);
    if (defaults.super_Message.super_MessageLite._vptr_MessageLite == (_func_int **)0x1) {
      if (ppFVar12 != (pointer)0x0) {
        lVar18 = 0;
        do {
          pFVar4 = *(FieldDescriptor **)(&feature_set->super_SymbolBase + lVar18);
          if (pFVar4 == (FieldDescriptor *)0x0) {
            pcVar13 = (local_c8->all_names_).payload_;
            pcVar14 = (char *)(ulong)*(ushort *)(pcVar13 + 2);
            pcVar13 = pcVar13 + ~(ulong)pcVar14;
            pcVar15 = "Unknown extension of ";
LAB_001e3116:
            args_1_00._M_str = pcVar14;
            args_1_00._M_len = (size_t)pcVar15;
            (anonymous_namespace)::
            Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                      ((char *)&_status_1,args_1_00,pcVar13);
LAB_001e311b:
            if (_status_1.rep_ != 1) {
              absl::lts_20250127::internal_statusor::
              StatusOrData<google::protobuf::FeatureSetDefaults>::
              StatusOrData<const_absl::lts_20250127::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::FeatureSetDefaults>,&_status_1);
              this_00 = (FeatureSetDefaults *)&_status_1;
              goto LAB_001e37d6;
            }
          }
          else {
            if (pFVar4->containing_type_ != local_c8) {
              pcVar13 = (pFVar4->all_names_).payload_;
              uVar2 = *(ushort *)(pcVar13 + 2);
              pcVar14 = (local_c8->all_names_).payload_;
              uVar3 = *(ushort *)(pcVar14 + 2);
              args_1._M_str._0_2_ = uVar2;
              args_1._M_len = (size_t)"Extension ";
              args_1._M_str._2_6_ = 0;
              args_3._M_str._0_2_ = uVar3;
              args_3._M_len = (size_t)" is not an extension of ";
              args_3._M_str._2_6_ = 0;
              (anonymous_namespace)::
              Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                        ((char *)&_status_1,args_1,pcVar13 + ~(ulong)uVar2,args_3,
                         pcVar14 + ~(ulong)uVar3);
              goto LAB_001e311b;
            }
            pDVar6 = FieldDescriptor::message_type(pFVar4);
            if (pDVar6 == (Descriptor *)0x0) {
              pcVar13 = (pFVar4->all_names_).payload_;
              pcVar14 = (char *)(ulong)*(ushort *)(pcVar13 + 2);
              pcVar13 = pcVar13 + ~(ulong)pcVar14;
              pcVar15 = "FeatureSet extension ";
              goto LAB_001e3116;
            }
            bVar1 = pFVar4->field_0x1;
            if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
              CompileDefaults();
              goto LAB_001e3813;
            }
            if ((bVar1 & 0x20) != 0) {
              pcVar13 = (pFVar4->all_names_).payload_;
              _status_3.rep_ = (uintptr_t)*(ushort *)(pcVar13 + 2);
              local_f0 = (AlphaNum *)(pcVar13 + ~_status_3.rep_);
              defaults.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x4b;
              defaults.super_Message.super_MessageLite._internal_metadata_.ptr_ =
                   (intptr_t)anon_var_dwarf_451595;
              absl::lts_20250127::StrCat_abi_cxx11_
                        ((string *)&editions,(lts_20250127 *)&defaults,(AlphaNum *)&_status_3,
                         local_f0);
              message._M_str =
                   (char *)editions.
                           super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                           .tree_.rightmost_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::checked_compare,_std::allocator<google::protobuf::Edition>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*,_2UL,_false>
                           .value;
              message._M_len = (size_t)&_status_1;
              absl::lts_20250127::FailedPreconditionError(message);
              if (editions.
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                  .
                  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                  .tree_.root_ !=
                  (node_type *)
                  &editions.
                   super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                   .
                   super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                   .tree_.size_) {
                operator_delete(editions.
                                super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                                .
                                super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                                .tree_.root_,
                                editions.
                                super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                                .
                                super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                                .tree_.size_ + 1);
              }
              goto LAB_001e311b;
            }
            pDVar6 = FieldDescriptor::message_type(pFVar4);
            if ((0 < pDVar6->extension_count_) ||
               (pDVar6 = FieldDescriptor::message_type(pFVar4), 0 < pDVar6->extension_range_count_))
            {
              pcVar13 = (pFVar4->all_names_).payload_;
              pcVar14 = (char *)(ulong)*(ushort *)(pcVar13 + 2);
              pcVar13 = pcVar13 + ~(ulong)pcVar14;
              pcVar15 = "Nested extensions in feature extension ";
              goto LAB_001e3116;
            }
          }
          pDVar6 = FieldDescriptor::message_type(pFVar4);
          anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)&defaults,pDVar6);
          if (defaults.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x1) {
            absl::lts_20250127::internal_statusor::
            StatusOrData<google::protobuf::FeatureSetDefaults>::
            StatusOrData<const_absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureSetDefaults>,(Status *)&defaults
                      );
            this_00 = &defaults;
LAB_001e37d6:
            absl::lts_20250127::Status::~Status((Status *)this_00);
            return __return_storage_ptr__;
          }
          lVar18 = lVar18 + 8;
        } while ((long)ppFVar12 * 8 - lVar18 != 0);
      }
      editions.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
      .tree_.root_ = (node_type *)
                     absl::lts_20250127::container_internal::
                     btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
                     ::EmptyNode()::empty_node;
      editions.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
      .tree_.rightmost_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::checked_compare,_std::allocator<google::protobuf::Edition>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
      .
      super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*,_2UL,_false>
      .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::checked_compare,_std::allocator<google::protobuf::Edition>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                )absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
                 ::EmptyNode()::empty_node;
      editions.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
      .tree_.size_ = 0;
      anon_unknown_21::CollectEditions(local_c8,minimum_edition,&editions);
      if (ppFVar12 != (pointer)0x0) {
        lVar18 = 0;
        do {
          pDVar6 = FieldDescriptor::message_type
                             (*(FieldDescriptor **)(&feature_set->super_SymbolBase + lVar18));
          anon_unknown_21::CollectEditions(pDVar6,minimum_edition,&editions);
          lVar18 = lVar18 + 8;
        } while ((long)ppFVar12 * 8 - lVar18 != 0);
      }
      if (editions.
          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
          .
          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
          .tree_.size_ == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&defaults,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                   ,0x1c4,"!editions.empty()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&defaults);
      }
      iVar19 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                        *)&editions);
      defaults.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)iVar19.node_;
      defaults.super_Message.super_MessageLite._internal_metadata_.ptr_._0_4_ = iVar19.position_;
      pEVar7 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
               ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                            *)&defaults);
      if (*pEVar7 == EDITION_LEGACY) {
        iVar19 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                 ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)&editions);
        defaults.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)iVar19.node_;
        defaults.super_Message.super_MessageLite._internal_metadata_.ptr_._0_4_ = iVar19.position_;
        pEVar7 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                              *)&defaults);
        if ((int)EVar17 < (int)*pEVar7) {
          iVar19 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                            *)&editions);
          defaults.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)iVar19.node_;
          defaults.super_Message.super_MessageLite._internal_metadata_.ptr_._0_4_ = iVar19.position_
          ;
          pEVar7 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                   ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                                *)&defaults);
          (anonymous_namespace)::
          Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
                    ((_anonymous_namespace_ *)&_status_3,"Minimum edition ",EVar17,
                     " is earlier than the oldest valid edition ",*pEVar7);
          absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>
          ::StatusOrData<absl::lts_20250127::Status,_0>
                    (&__return_storage_ptr__->
                      super_StatusOrData<google::protobuf::FeatureSetDefaults>,&_status_3);
          absl::lts_20250127::Status::~Status(&_status_3);
        }
        else {
          FeatureSetDefaults::FeatureSetDefaults(&defaults,(Arena *)0x0);
          FeatureSetDefaults::set_minimum_edition(&defaults,EVar17);
          FeatureSetDefaults::set_maximum_edition(&defaults,minimum_edition);
          std::make_unique<google::protobuf::DynamicMessageFactory>();
          iVar19 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                            *)&editions);
          _status_1.rep_ = (uintptr_t)iVar19.node_;
          iVar19 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)&editions);
          while( true ) {
            other._12_4_ = 0;
            other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                           *)SUB128(iVar19._0_12_,0);
            other.position_ = SUB124(iVar19._0_12_,8);
            bVar5 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                    ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                              *)&_status_1,other);
            if (bVar5) break;
            pEVar7 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                     ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                                  *)&_status_1);
            pMVar8 = (MessageLite *)(**(code **)(*local_c0 + 0x10))();
            pMVar8 = MessageLite::New(pMVar8,(Arena *)0x0);
            pMVar9 = (MessageLite *)(**(code **)(*local_c0 + 0x10))();
            pMVar9 = MessageLite::New(pMVar9,(Arena *)0x0);
            anon_unknown_21::FillDefaults
                      ((anon_unknown_21 *)&_status_3,*pEVar7,(Message *)pMVar8,(Message *)pMVar9);
            if (_status_3.rep_ != 1) {
              absl::lts_20250127::internal_statusor::
              StatusOrData<google::protobuf::FeatureSetDefaults>::
              StatusOrData<const_absl::lts_20250127::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::FeatureSetDefaults>,&_status_3);
              absl::lts_20250127::Status::~Status(&_status_3);
LAB_001e3750:
              (*pMVar9->_vptr_MessageLite[1])(pMVar9);
              (*pMVar8->_vptr_MessageLite[1])(pMVar8);
              goto LAB_001e3762;
            }
            if (ppFVar12 != (pointer)0x0) {
              lVar18 = 0;
              do {
                pFVar4 = *(FieldDescriptor **)(&feature_set->super_SymbolBase + lVar18);
                EVar17 = *pEVar7;
                MVar20 = Message::GetMetadata((Message *)pMVar8);
                fixed = Reflection::MutableMessage
                                  (MVar20.reflection,(Message *)pMVar8,pFVar4,(MessageFactory *)0x0)
                ;
                MVar20 = Message::GetMetadata((Message *)pMVar9);
                overridable = Reflection::MutableMessage
                                        (MVar20.reflection,(Message *)pMVar9,pFVar4,
                                         (MessageFactory *)0x0);
                anon_unknown_21::FillDefaults
                          ((anon_unknown_21 *)&_status_3,EVar17,fixed,overridable);
                if (_status_3.rep_ != 1) {
                  absl::lts_20250127::internal_statusor::
                  StatusOrData<google::protobuf::FeatureSetDefaults>::
                  StatusOrData<const_absl::lts_20250127::Status,_0>
                            (&__return_storage_ptr__->
                              super_StatusOrData<google::protobuf::FeatureSetDefaults>,&_status_3);
                  absl::lts_20250127::Status::~Status(&_status_3);
                  goto LAB_001e3750;
                }
                lVar18 = lVar18 + 8;
              } while ((long)ppFVar12 * 8 != lVar18);
            }
            pvVar10 = internal::RepeatedPtrFieldBase::AddMessageLite
                                (&defaults.field_0._impl_.defaults_.super_RepeatedPtrFieldBase,
                                 Arena::
                                 DefaultConstruct<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                                );
            EVar17 = *pEVar7;
            bVar5 = internal::ValidateEnum(EVar17,(uint32_t *)Edition_internal_data_);
            if (!bVar5) {
              __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                            ,0x5164,
                            "void google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::_internal_set_edition(::google::protobuf::Edition)"
                           );
            }
            *(Edition *)((long)pvVar10 + 0x28) = EVar17;
            *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 6;
            pMVar11 = *(MessageLite **)((long)pvVar10 + 0x20);
            if (pMVar11 == (MessageLite *)0x0) {
              pAVar16 = *(Arena **)((long)pvVar10 + 8);
              if (((ulong)pAVar16 & 1) != 0) {
                pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
              }
              pMVar11 = (MessageLite *)
                        Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar16);
              *(MessageLite **)((long)pvVar10 + 0x20) = pMVar11;
            }
            MessageLite::SerializeAsString_abi_cxx11_((string *)&_status_3,pMVar8);
            data._M_str = (char *)_status_3.rep_;
            data._M_len = (size_t)local_f0;
            MessageLite::MergeFromString(pMVar11,data);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_status_3.rep_ != local_e8) {
              operator_delete((void *)_status_3.rep_,local_e8[0]._M_allocated_capacity + 1);
            }
            *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 1;
            pMVar11 = *(MessageLite **)((long)pvVar10 + 0x18);
            if (pMVar11 == (MessageLite *)0x0) {
              pAVar16 = *(Arena **)((long)pvVar10 + 8);
              if (((ulong)pAVar16 & 1) != 0) {
                pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
              }
              pMVar11 = (MessageLite *)
                        Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar16);
              *(MessageLite **)((long)pvVar10 + 0x18) = pMVar11;
            }
            MessageLite::SerializeAsString_abi_cxx11_((string *)&_status_3,pMVar9);
            data_00._M_str = (char *)_status_3.rep_;
            data_00._M_len = (size_t)local_f0;
            MessageLite::MergeFromString(pMVar11,data_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_status_3.rep_ != local_e8) {
              operator_delete((void *)_status_3.rep_,local_e8[0]._M_allocated_capacity + 1);
            }
            (*pMVar9->_vptr_MessageLite[1])(pMVar9);
            (*pMVar8->_vptr_MessageLite[1])(pMVar8);
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
            ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                         *)&_status_1);
          }
          FeatureSetDefaults::FeatureSetDefaults
                    (&(__return_storage_ptr__->
                      super_StatusOrData<google::protobuf::FeatureSetDefaults>).field_1.data_,
                     (Arena *)0x0,&defaults);
          (__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>).field_0
               = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
                 0x1;
LAB_001e3762:
          if (local_c0 != (long *)0x0) {
            (**(code **)(*local_c0 + 8))();
          }
          FeatureSetDefaults::~FeatureSetDefaults(&defaults);
        }
      }
      else {
        iVar19 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                 ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)&editions);
        defaults.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)iVar19.node_;
        defaults.super_Message.super_MessageLite._internal_metadata_.ptr_._0_4_ = iVar19.position_;
        pEVar7 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                              *)&defaults);
        (anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
                  ((_anonymous_namespace_ *)&_status_3,"Minimum edition ",*pEVar7,
                   " is not EDITION_LEGACY");
        absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
        StatusOrData<absl::lts_20250127::Status,_0>
                  (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>
                   ,&_status_3);
        if ((_status_3.rep_ & 1) == 0) {
          absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)_status_3.rep_);
        }
      }
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
      ::~btree((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                *)&editions);
    }
    else {
LAB_001e3813:
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
      StatusOrData<const_absl::lts_20250127::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
                 (Status *)&defaults);
      if (((ulong)defaults.super_Message.super_MessageLite._vptr_MessageLite & 1) == 0) {
        absl::lts_20250127::status_internal::StatusRep::Unref
                  ((StatusRep *)defaults.super_Message.super_MessageLite._vptr_MessageLite);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSetDefaults> FeatureResolver::CompileDefaults(
    const Descriptor* feature_set,
    absl::Span<const FieldDescriptor* const> extensions,
    Edition minimum_edition, Edition maximum_edition) {
  if (minimum_edition > maximum_edition) {
    return Error("Invalid edition range, edition ", minimum_edition,
                 " is newer than edition ", maximum_edition);
  }
  // Find and validate the FeatureSet in the pool.
  if (feature_set == nullptr) {
    return Error(
        "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
  }
  RETURN_IF_ERROR(ValidateDescriptor(*feature_set));

  // Collect and validate all the FeatureSet extensions.
  for (const auto* extension : extensions) {
    RETURN_IF_ERROR(ValidateExtension(*feature_set, extension));
    RETURN_IF_ERROR(ValidateDescriptor(*extension->message_type()));
  }

  // Collect all the editions with unique defaults.
  absl::btree_set<Edition> editions;
  CollectEditions(*feature_set, maximum_edition, editions);
  for (const auto* extension : extensions) {
    CollectEditions(*extension->message_type(), maximum_edition, editions);
  }
  // Sanity check validation conditions above.
  ABSL_CHECK(!editions.empty());
  if (*editions.begin() != EDITION_LEGACY) {
    return Error("Minimum edition ", *editions.begin(),
                 " is not EDITION_LEGACY");
  }

  if (*editions.begin() > minimum_edition) {
    return Error("Minimum edition ", minimum_edition,
                 " is earlier than the oldest valid edition ",
                 *editions.begin());
  }

  // Fill the default spec.
  FeatureSetDefaults defaults;
  defaults.set_minimum_edition(minimum_edition);
  defaults.set_maximum_edition(maximum_edition);
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  for (const auto& edition : editions) {
    auto fixed_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    auto overridable_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    RETURN_IF_ERROR(FillDefaults(edition, *fixed_defaults_dynamic,
                                 *overridable_defaults_dynamic));
    for (const auto* extension : extensions) {
      RETURN_IF_ERROR(FillDefaults(
          edition,
          *fixed_defaults_dynamic->GetReflection()->MutableMessage(
              fixed_defaults_dynamic.get(), extension),
          *overridable_defaults_dynamic->GetReflection()->MutableMessage(
              overridable_defaults_dynamic.get(), extension)));
    }
    auto* edition_defaults = defaults.mutable_defaults()->Add();
    edition_defaults->set_edition(edition);
    edition_defaults->mutable_fixed_features()->MergeFromString(
        fixed_defaults_dynamic->SerializeAsString());
    edition_defaults->mutable_overridable_features()->MergeFromString(
        overridable_defaults_dynamic->SerializeAsString());
  }
  return defaults;
}